

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgproperty.cpp
# Opt level: O3

float __thiscall
lunasvg::LengthContext::viewportDimension(LengthContext *this,LengthDirection direction)

{
  undefined3 in_register_00000031;
  Size SVar1;
  float fVar2;
  
  SVar1 = SVGElement::currentViewportSize(this->m_element);
  fVar2 = SVar1.h;
  if (CONCAT31(in_register_00000031,direction) == 1) {
    SVar1.h = 0.0;
    SVar1.w = fVar2;
  }
  else if (CONCAT31(in_register_00000031,direction) != 0) {
    SVar1.w = SQRT(SVar1.w * SVar1.w + fVar2 * fVar2) / 1.4142135;
    SVar1.h = 0.0;
  }
  return SVar1.w;
}

Assistant:

float LengthContext::viewportDimension(LengthDirection direction) const
{
    auto viewportSize = m_element->currentViewportSize();
    switch(direction) {
    case LengthDirection::Horizontal:
        return viewportSize.w;
    case LengthDirection::Vertical:
        return viewportSize.h;
    default:
        return std::sqrt(viewportSize.w * viewportSize.w + viewportSize.h * viewportSize.h) / PLUTOVG_SQRT2;
    }
}